

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O1

DdNode ** Aig_ManCreatePartitions(DdManager *dd,Aig_Man_t *p,int fReorder,int fVerbose)

{
  void *pvVar1;
  FILE *pFVar2;
  uint uVar3;
  DdNode **nodeArray;
  ulong uVar4;
  DdNode *pDVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  iVar6 = p->nTruePis + p->nRegs;
  if (dd->size != iVar6) {
    __assert_fail("dd->size == Saig_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrReach.c"
                  ,0xc3,"DdNode **Aig_ManCreatePartitions(DdManager *, Aig_Man_t *, int, int)");
  }
  Cudd_bddIthVar(dd,p->nRegs + iVar6 + -1);
  if (fReorder == 0) {
    Cudd_AutodynDisable(dd);
  }
  else {
    Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  }
  lVar8 = (long)p->nRegs;
  nodeArray = (DdNode **)malloc(lVar8 * 8);
  if (0 < lVar8) {
    lVar7 = 0;
    do {
      uVar4 = (ulong)(uint)p->nTruePos + lVar7;
      iVar6 = (int)uVar4;
      if ((iVar6 < 0) || (p->vCos->nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCos->pArray[uVar4 & 0xffffffff];
      pDVar5 = Cudd_bddIthVar(dd,(int)lVar8 + p->nTruePis + (int)lVar7);
      pDVar5 = Cudd_bddXnor(dd,pDVar5,*(DdNode **)((long)pvVar1 + 0x28));
      nodeArray[lVar7] = pDVar5;
      Cudd_Ref(pDVar5);
      lVar7 = lVar7 + 1;
      lVar8 = (long)p->nRegs;
    } while (lVar7 < lVar8);
  }
  Aig_ManFreeGlobalBdds(p,dd);
  pFVar2 = _stdout;
  if (fReorder != 0) {
    if (fVerbose == 0) {
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
      Cudd_AutodynDisable(dd);
    }
    else {
      uVar3 = Cudd_SharingSize(nodeArray,p->nRegs);
      fprintf(pFVar2,"BDD nodes in the partitions before reordering %d.\n",(ulong)uVar3);
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
      Cudd_AutodynDisable(dd);
      pFVar2 = _stdout;
      uVar3 = Cudd_SharingSize(nodeArray,p->nRegs);
      fprintf(pFVar2,"BDD nodes in the partitions after reordering %d.\n",(ulong)uVar3);
    }
  }
  return nodeArray;
}

Assistant:

DdNode ** Aig_ManCreatePartitions( DdManager * dd, Aig_Man_t * p, int fReorder, int fVerbose )
{
    DdNode ** pbParts;
    DdNode * bVar;
    Aig_Obj_t * pNode;
    int i;

    // extand the BDD manager to represent NS variables
    assert( dd->size == Saig_ManCiNum(p) );
    Cudd_bddIthVar( dd, Saig_ManCiNum(p) + Saig_ManRegNum(p) - 1 );

    // enable reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    else
        Cudd_AutodynDisable( dd );

    // compute the transition relation
    pbParts = ABC_ALLOC( DdNode *, Saig_ManRegNum(p) );
    Saig_ManForEachLi( p, pNode, i )
    {
        bVar  = Cudd_bddIthVar( dd, Saig_ManCiNum(p) + i );
        pbParts[i] = Cudd_bddXnor( dd, bVar, Aig_ObjGlobalBdd(pNode) );  Cudd_Ref( pbParts[i] );
    }
    // free global BDDs
    Aig_ManFreeGlobalBdds( p, dd );

    // reorder and disable reordering
    if ( fReorder )
    {
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the partitions before reordering %d.\n", Cudd_SharingSize(pbParts,Saig_ManRegNum(p)) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        Cudd_AutodynDisable( dd );
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the partitions after reordering %d.\n", Cudd_SharingSize(pbParts,Saig_ManRegNum(p)) );
    }
    return pbParts;
}